

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O1

Element * __thiscall Rml::Element::Closest(Element *this,String *selectors)

{
  pointer pcVar1;
  pointer ppSVar2;
  bool bVar3;
  Element *pEVar4;
  StyleSheetNodeListRaw *__range2;
  pointer ppSVar5;
  Element *element;
  StyleSheetNodeListRaw leaf_nodes;
  StyleSheetNode root_node;
  StyleSheetNodeListRaw local_168;
  String local_150;
  undefined1 local_130 [96];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d0 [24];
  vector<Rml::AttributeSelector,_std::allocator<Rml::AttributeSelector>_> local_b8;
  vector<Rml::StructuralSelector,_std::allocator<Rml::StructuralSelector>_> local_a0;
  Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
  local_78;
  vector<std::unique_ptr<Rml::StyleSheetNode,_std::default_delete<Rml::StyleSheetNode>_>,_std::allocator<std::unique_ptr<Rml::StyleSheetNode,_std::default_delete<Rml::StyleSheetNode>_>_>_>
  local_48;
  
  StyleSheetNode::StyleSheetNode((StyleSheetNode *)local_130);
  StyleSheetParser::ConstructNodes(&local_168,(StyleSheetNode *)local_130,selectors);
  element = this;
  if (local_168.super__Vector_base<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      local_168.super__Vector_base<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pcVar1 = (selectors->_M_dataplus)._M_p;
    GetAddress_abi_cxx11_(&local_150,this,false,true);
    Log::Message(LT_WARNING,"Query selector \'%s\' is empty. In element %s",pcVar1,
                 local_150._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
LAB_0021bac0:
    pEVar4 = (Element *)0x0;
  }
  else {
    do {
      ppSVar2 = local_168.
                super__Vector_base<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      element = element->parent;
      ppSVar5 = local_168.
                super__Vector_base<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (element == (Element *)0x0) goto LAB_0021bac0;
      while ((pEVar4 = (Element *)selectors, ppSVar5 != ppSVar2 &&
             (bVar3 = StyleSheetNode::IsApplicable(*ppSVar5,element,this), pEVar4 = element, !bVar3)
             )) {
        ppSVar5 = ppSVar5 + 1;
      }
      selectors = (String *)pEVar4;
    } while (ppSVar5 == ppSVar2);
  }
  if (local_168.super__Vector_base<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.
                    super__Vector_base<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_168.
                          super__Vector_base<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.
                          super__Vector_base<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  ::std::
  vector<std::unique_ptr<Rml::StyleSheetNode,_std::default_delete<Rml::StyleSheetNode>_>,_std::allocator<std::unique_ptr<Rml::StyleSheetNode,_std::default_delete<Rml::StyleSheetNode>_>_>_>
  ::~vector(&local_48);
  robin_hood::detail::
  Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
  ::destroy(&local_78);
  ::std::vector<Rml::StructuralSelector,_std::allocator<Rml::StructuralSelector>_>::~vector
            (&local_a0);
  ::std::vector<Rml::AttributeSelector,_std::allocator<Rml::AttributeSelector>_>::~vector(&local_b8)
  ;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_d0);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_130 + 0x48));
  if ((undefined1 *)local_130._40_8_ != local_130 + 0x38) {
    operator_delete((void *)local_130._40_8_,local_130._56_8_ + 1);
  }
  if ((undefined1 *)local_130._8_8_ != local_130 + 0x18) {
    operator_delete((void *)local_130._8_8_,local_130._24_8_ + 1);
  }
  return pEVar4;
}

Assistant:

Element* Element::Closest(const String& selectors) const
{
	StyleSheetNode root_node;
	StyleSheetNodeListRaw leaf_nodes = StyleSheetParser::ConstructNodes(root_node, selectors);

	if (leaf_nodes.empty())
	{
		Log::Message(Log::LT_WARNING, "Query selector '%s' is empty. In element %s", selectors.c_str(), GetAddress().c_str());
		return nullptr;
	}

	Element* parent = GetParentNode();

	while (parent)
	{
		for (const StyleSheetNode* node : leaf_nodes)
		{
			if (node->IsApplicable(parent, this))
			{
				return parent;
			}
		}

		parent = parent->GetParentNode();
	}

	return nullptr;
}